

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

void __thiscall
icu_63::CollationRuleParser::parseRuleChain(CollationRuleParser *this,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *this_00;
  bool bVar2;
  char16_t cVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  int i;
  uint strength;
  char *reason;
  
  uVar4 = parseResetAndPosition(this,errorCode);
  bVar2 = false;
  do {
    while( true ) {
      uVar5 = parseRelationOperator(this,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        return;
      }
      if (-1 < (int)uVar5) break;
      this_00 = this->rules;
      sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (this_00->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      if ((iVar6 <= this->ruleIndex) ||
         (cVar3 = UnicodeString::doCharAt(this_00,this->ruleIndex), cVar3 != L'#')) {
        if (bVar2) {
          return;
        }
        reason = "reset not followed by a relation";
        goto LAB_00232e12;
      }
      iVar6 = skipComment(this,this->ruleIndex + 1);
      this->ruleIndex = iVar6;
    }
    strength = uVar5 & 0xf;
    if ((int)uVar4 < 0xf) {
      if (bVar2) {
        reason = "reset-before strength followed by a stronger relation";
        if ((int)strength < (int)uVar4) {
LAB_00232e12:
          setParseError(this,reason,errorCode);
          return;
        }
      }
      else {
        reason = "reset-before strength differs from its first relation";
        if (strength != uVar4) goto LAB_00232e12;
      }
    }
    i = (uVar5 >> 8) + this->ruleIndex;
    if ((uVar5 & 0x10) == 0) {
      parseRelationStrings(this,strength,i,errorCode);
    }
    else {
      parseStarredCharacters(this,strength,i,errorCode);
    }
    bVar2 = true;
    if (U_ZERO_ERROR < *errorCode) {
      return;
    }
  } while( true );
}

Assistant:

void
CollationRuleParser::parseRuleChain(UErrorCode &errorCode) {
    int32_t resetStrength = parseResetAndPosition(errorCode);
    UBool isFirstRelation = TRUE;
    for(;;) {
        int32_t result = parseRelationOperator(errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(result < 0) {
            if(ruleIndex < rules->length() && rules->charAt(ruleIndex) == 0x23) {
                // '#' starts a comment, until the end of the line
                ruleIndex = skipComment(ruleIndex + 1);
                continue;
            }
            if(isFirstRelation) {
                setParseError("reset not followed by a relation", errorCode);
            }
            return;
        }
        int32_t strength = result & STRENGTH_MASK;
        if(resetStrength < UCOL_IDENTICAL) {
            // reset-before rule chain
            if(isFirstRelation) {
                if(strength != resetStrength) {
                    setParseError("reset-before strength differs from its first relation", errorCode);
                    return;
                }
            } else {
                if(strength < resetStrength) {
                    setParseError("reset-before strength followed by a stronger relation", errorCode);
                    return;
                }
            }
        }
        int32_t i = ruleIndex + (result >> OFFSET_SHIFT);  // skip over the relation operator
        if((result & STARRED_FLAG) == 0) {
            parseRelationStrings(strength, i, errorCode);
        } else {
            parseStarredCharacters(strength, i, errorCode);
        }
        if(U_FAILURE(errorCode)) { return; }
        isFirstRelation = FALSE;
    }
}